

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

void enet_peer_dispatch_incoming_reliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ENetList *excludeCommand;
  ENetList *pEVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t uVar4;
  int iVar5;
  _ENetListNode *p_Var6;
  _ENetListNode *p_Var7;
  _ENetHost *p_Var8;
  _ENetListNode *p_Var9;
  ENetListIterator first;
  ENetIncomingCommand *incomingCommand;
  _ENetListNode *p_Var10;
  ENetListIterator pEVar11;
  ENetListIterator pEVar12;
  ushort uVar13;
  
  p_Var9 = (channel->incomingReliableCommands).sentinel.next;
  p_Var10 = p_Var9;
  if (p_Var9 != &(channel->incomingReliableCommands).sentinel) {
    do {
      if ((*(int *)&p_Var10[4].previous != 0) ||
         (uVar4 = *(uint16_t *)&p_Var10[1].next,
         uVar4 != (uint16_t)(channel->incomingReliableSequenceNumber + 1))) break;
      channel->incomingReliableSequenceNumber = uVar4;
      iVar5 = *(int *)((long)&p_Var10[4].next + 4);
      if (iVar5 != 0) {
        channel->incomingReliableSequenceNumber = (uVar4 + (short)iVar5) - 1;
      }
      p_Var10 = p_Var10->next;
    } while (p_Var10 != &(channel->incomingReliableCommands).sentinel);
    if (p_Var10 != p_Var9) {
      channel->incomingUnreliableSequenceNumber = 0;
      p_Var10 = p_Var10->previous;
      p_Var6 = p_Var10->next;
      p_Var7 = p_Var9->previous;
      p_Var7->next = p_Var6;
      p_Var6->previous = p_Var7;
      p_Var6 = (peer->dispatchedCommands).sentinel.previous;
      p_Var9->previous = p_Var6;
      p_Var10->next = &(peer->dispatchedCommands).sentinel;
      p_Var6->next = p_Var9;
      (peer->dispatchedCommands).sentinel.previous = p_Var10;
      if (peer->needsDispatch == 0) {
        p_Var8 = peer->host;
        p_Var9 = (p_Var8->dispatchQueue).sentinel.previous;
        (peer->dispatchList).previous = p_Var9;
        (peer->dispatchList).next = &(p_Var8->dispatchQueue).sentinel;
        p_Var9->next = &peer->dispatchList;
        (p_Var8->dispatchQueue).sentinel.previous = &peer->dispatchList;
        peer->needsDispatch = 1;
      }
      if ((channel->incomingUnreliableCommands).sentinel.next !=
          &(channel->incomingUnreliableCommands).sentinel) {
        excludeCommand = &channel->incomingUnreliableCommands;
        p_Var9 = (channel->incomingUnreliableCommands).sentinel.next;
        if (p_Var9 != &excludeCommand->sentinel) {
          pEVar1 = &peer->dispatchedCommands;
          pEVar11 = p_Var9;
          pEVar12 = p_Var9;
          do {
            if (((ulong)pEVar11[1].next & 0xf00000000) != 0x900000000) {
              uVar2 = *(ushort *)&pEVar11[1].next;
              uVar3 = channel->incomingReliableSequenceNumber;
              if (uVar2 == uVar3) {
                if (*(int *)&pEVar11[4].previous == 0) {
                  channel->incomingUnreliableSequenceNumber =
                       *(uint16_t *)((long)&pEVar11[1].next + 2);
                  goto LAB_0010669a;
                }
                if (pEVar12 == pEVar11) {
                  if (p_Var9 != pEVar12) {
                    p_Var9 = pEVar11->previous;
                  }
                }
                else {
                  p_Var9 = pEVar11->previous;
                  p_Var10 = p_Var9->next;
                  p_Var6 = pEVar12->previous;
                  p_Var6->next = p_Var10;
                  p_Var10->previous = p_Var6;
                  p_Var10 = (peer->dispatchedCommands).sentinel.previous;
                  pEVar12->previous = p_Var10;
                  p_Var9->next = &pEVar1->sentinel;
                  p_Var10->next = pEVar12;
                  (peer->dispatchedCommands).sentinel.previous = p_Var9;
                  p_Var9 = pEVar11;
                  if (peer->needsDispatch == 0) {
                    p_Var8 = peer->host;
                    p_Var10 = (p_Var8->dispatchQueue).sentinel.previous;
                    (peer->dispatchList).previous = p_Var10;
                    (peer->dispatchList).next = &(p_Var8->dispatchQueue).sentinel;
                    p_Var10->next = &peer->dispatchList;
                    (p_Var8->dispatchQueue).sentinel.previous = &peer->dispatchList;
                    peer->needsDispatch = 1;
                  }
                }
              }
              else {
                uVar13 = (uVar2 >> 0xc) + 0x10;
                if (uVar3 <= uVar2) {
                  uVar13 = uVar2 >> 0xc;
                }
                if (uVar3 >> 0xc <= uVar13 && uVar13 < (ushort)((uVar3 >> 0xc) + 7)) break;
                p_Var9 = pEVar11->next;
                if (pEVar12 != pEVar11) {
                  p_Var10 = pEVar11->previous;
                  p_Var6 = p_Var10->next;
                  p_Var7 = pEVar12->previous;
                  p_Var7->next = p_Var6;
                  p_Var6->previous = p_Var7;
                  p_Var6 = (peer->dispatchedCommands).sentinel.previous;
                  pEVar12->previous = p_Var6;
                  p_Var10->next = &pEVar1->sentinel;
                  p_Var6->next = pEVar12;
                  (peer->dispatchedCommands).sentinel.previous = p_Var10;
                  if (peer->needsDispatch == 0) {
                    p_Var8 = peer->host;
                    p_Var10 = (p_Var8->dispatchQueue).sentinel.previous;
                    (peer->dispatchList).previous = p_Var10;
                    (peer->dispatchList).next = &(p_Var8->dispatchQueue).sentinel;
                    p_Var10->next = &peer->dispatchList;
                    (p_Var8->dispatchQueue).sentinel.previous = &peer->dispatchList;
                    peer->needsDispatch = 1;
                  }
                }
              }
              pEVar12 = pEVar11->next;
            }
LAB_0010669a:
            pEVar11 = pEVar11->next;
          } while (pEVar11 != &excludeCommand->sentinel);
          if (pEVar12 != pEVar11) {
            p_Var9 = pEVar11->previous;
            p_Var10 = p_Var9->next;
            p_Var6 = pEVar12->previous;
            p_Var6->next = p_Var10;
            p_Var10->previous = p_Var6;
            p_Var10 = (peer->dispatchedCommands).sentinel.previous;
            pEVar12->previous = p_Var10;
            p_Var9->next = &pEVar1->sentinel;
            p_Var10->next = pEVar12;
            (peer->dispatchedCommands).sentinel.previous = p_Var9;
            p_Var9 = pEVar11;
            if (peer->needsDispatch == 0) {
              p_Var8 = peer->host;
              p_Var10 = (p_Var8->dispatchQueue).sentinel.previous;
              (peer->dispatchList).previous = p_Var10;
              (peer->dispatchList).next = &(p_Var8->dispatchQueue).sentinel;
              p_Var10->next = &peer->dispatchList;
              (p_Var8->dispatchQueue).sentinel.previous = &peer->dispatchList;
              peer->needsDispatch = 1;
            }
          }
        }
        enet_peer_remove_incoming_commands
                  ((ENetList *)(excludeCommand->sentinel).next,p_Var9,
                   &queuedCommand->incomingCommandList,(ENetIncomingCommand *)excludeCommand);
        return;
      }
    }
  }
  return;
}

Assistant:

void enet_peer_dispatch_incoming_reliable_commands(ENetPeer* peer, ENetChannel* channel, ENetIncomingCommand* queuedCommand) {
	ENetListIterator currentCommand;

	for (currentCommand = enet_list_begin(&channel->incomingReliableCommands); currentCommand != enet_list_end(&channel->incomingReliableCommands); currentCommand = enet_list_next(currentCommand)) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;

		if (incomingCommand->fragmentsRemaining > 0 || incomingCommand->reliableSequenceNumber != (uint16_t)(channel->incomingReliableSequenceNumber + 1))
			break;

		channel->incomingReliableSequenceNumber = incomingCommand->reliableSequenceNumber;

		if (incomingCommand->fragmentCount > 0)
			channel->incomingReliableSequenceNumber += incomingCommand->fragmentCount - 1;
	}

	if (currentCommand == enet_list_begin(&channel->incomingReliableCommands))
		return;

	channel->incomingUnreliableSequenceNumber = 0;

	enet_list_move(enet_list_end(&peer->dispatchedCommands), enet_list_begin(&channel->incomingReliableCommands), enet_list_previous(currentCommand));

	if (!peer->needsDispatch) {
		enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

		peer->needsDispatch = 1;
	}

	if (!enet_list_empty(&channel->incomingUnreliableCommands))
		enet_peer_dispatch_incoming_unreliable_commands(peer, channel, queuedCommand);
}